

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMutex.h
# Opt level: O2

void __thiscall liblogger::LogMutex::LogMutex(LogMutex *this)

{
  int iVar1;
  pthread_mutexattr_t attr;
  
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)&attr);
      if (iVar1 == 0) {
        iVar1 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
        if (iVar1 == 0) {
          return;
        }
      }
    }
  }
  abort();
}

Assistant:

LogMutex() {
				pthread_mutexattr_t attr;
				if (pthread_mutexattr_init(&attr) != 0)
					abort();

				if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE) != 0)
					abort();

				if (pthread_mutex_init(&m_mutex, &attr) != 0)
					abort();

				if (pthread_mutexattr_destroy(&attr) != 0)
					abort();
			}